

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O2

void SubVerifyBase<int,int>(char *types)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  int t;
  TestCase<int,_int,_4> TVar4;
  allocator local_b1;
  char *local_b0;
  string msg;
  string local_88;
  TestVector<int,_int,_4> tests;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  tests.test_cases = (TestCase<int,_int,_4> *)0x0;
  tests.count = 0;
  tests.current = 0;
  local_b0 = types;
  TVar4 = TestVector<int,_int,_4>::GetNext(&tests);
  while( true ) {
    if (tests.count <= tests.current) break;
    t = TVar4.x;
    lVar1 = (long)t - (TVar4._0_8_ >> 0x20);
    uVar3 = TVar4._8_4_ & 0xff;
    bVar2 = TVar4.fExpected;
    rhs.m_int = TVar4.y;
    if (bVar2 != ((int)lVar1 == lVar1)) {
      std::__cxx11::string::string((string *)&local_88,"Error in case ",(allocator *)&local_50);
      std::operator+(&msg,&local_88,local_b0);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::string
                ((string *)&local_88,
                 (char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(int)msg._M_dataplus._M_p),
                 (allocator *)&local_50);
      err_msg<int,int>(&local_88,t,rhs.m_int,(bool)(bVar2 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p._0_4_ = t;
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&msg,rhs.m_int);
    if (uVar3 != 1) {
      std::__cxx11::string::string((string *)&local_50,"Error in case ",&local_b1);
      std::operator+(&local_88,&local_50,local_b0);
      std::operator+(&msg,&local_88," throw (1): ");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string
                ((string *)&local_88,
                 (char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(int)msg._M_dataplus._M_p),
                 (allocator *)&local_50);
      err_msg<int,int>(&local_88,t,rhs.m_int,(bool)(bVar2 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p._0_4_ = t;
    operator-=((int *)&msg,rhs);
    if (uVar3 != 1) {
      std::__cxx11::string::string((string *)&local_50,"Error in case ",&local_b1);
      std::operator+(&local_88,&local_50,local_b0);
      std::operator+(&msg,&local_88," throw (2): ");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string
                ((string *)&local_88,
                 (char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(int)msg._M_dataplus._M_p),
                 (allocator *)&local_50);
      err_msg<int,int>(&local_88,t,rhs.m_int,(bool)(bVar2 & 1));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&msg);
    }
    TVar4 = TestVector<int,_int,_4>::GetNext(&tests);
  }
  return;
}

Assistant:

void SubVerifyBase(const char* types)
{
    TestVector< T, U, OpType::Sub > tests;
    TestCase< T, U, OpType::Sub > test = tests.GetNext();

    while (!tests.Done())
    {
        T ret;
        if (SafeSubtract(test.x, test.y, ret) != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types;
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Now test throwing version
        bool fSuccess = true;
        try
        {
            SafeInt<T> si(test.x);
            si -= test.y;
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (1): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Also need to test the version that assigns back out
        // to a plain int, as it has different logic
        fSuccess = true;
        try
        {
            T x(test.x);
            x -= SafeInt<U>(test.y);
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (2): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        test = tests.GetNext();
    }
}